

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

Vec_Ptr_t *
Aig_ManRegProjectOnehots(Aig_Man_t *pAig,Aig_Man_t *pPart,Vec_Ptr_t *vOnehots,int fVerbose)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  pVVar8 = pPart->vCis;
  if (0 < pVVar8->nSize) {
    lVar6 = 0;
    do {
      *(int *)((long)pVVar8->pArray[lVar6] + 0x28) = (int)lVar6;
      lVar6 = lVar6 + 1;
      pVVar8 = pPart->vCis;
    } while (lVar6 < pVVar8->nSize);
  }
  if (vOnehots->nSize < 1) {
    pVVar8 = (Vec_Ptr_t *)0x0;
  }
  else {
    iVar1 = pAig->nObjs[2];
    iVar2 = pAig->nRegs;
    lVar6 = 0;
    pVVar8 = (Vec_Ptr_t *)0x0;
    do {
      pvVar3 = vOnehots->pArray[lVar6];
      uVar13 = (ulong)*(uint *)((long)pvVar3 + 4);
      if ((int)*(uint *)((long)pvVar3 + 4) < 1) {
        p = (Vec_Int_t *)0x0;
      }
      else {
        lVar11 = 0;
        p = (Vec_Int_t *)0x0;
        do {
          uVar5 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar11 * 4) + (iVar1 - iVar2);
          if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = pAig->vCis->pArray[uVar5];
          if (*(int *)((long)pvVar4 + 0x20) == pAig->nTravIds) {
            if (p == (Vec_Int_t *)0x0) {
              p = (Vec_Int_t *)malloc(0x10);
              iVar12 = (int)uVar13;
              if (iVar12 - 1U < 0xf) {
                iVar12 = 0x10;
              }
              p->nSize = 0;
              p->nCap = iVar12;
              if (iVar12 == 0) {
                piVar7 = (int *)0x0;
              }
              else {
                piVar7 = (int *)malloc((long)iVar12 << 2);
              }
              p->pArray = piVar7;
            }
            Vec_IntPush(p,*(int *)(*(long *)((long)pvVar4 + 0x28) + 0x28));
          }
          lVar11 = lVar11 + 1;
          uVar13 = (ulong)*(int *)((long)pvVar3 + 4);
        } while (lVar11 < (long)uVar13);
      }
      if (p != (Vec_Int_t *)0x0) {
        if (p->nSize < 2) {
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
            p->pArray = (int *)0x0;
          }
          free(p);
        }
        else {
          if (pVVar8 == (Vec_Ptr_t *)0x0) {
            pVVar8 = (Vec_Ptr_t *)malloc(0x10);
            pVVar8->nCap = 100;
            pVVar8->nSize = 0;
            ppvVar9 = (void **)malloc(800);
            pVVar8->pArray = ppvVar9;
          }
          uVar5 = pVVar8->nCap;
          if (pVVar8->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (pVVar8->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
              }
              pVVar8->pArray = ppvVar9;
              iVar12 = 0x10;
            }
            else {
              iVar12 = uVar5 * 2;
              if (iVar12 <= (int)uVar5) goto LAB_006c05de;
              if (pVVar8->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar5 << 4);
              }
              pVVar8->pArray = ppvVar9;
            }
            pVVar8->nCap = iVar12;
          }
LAB_006c05de:
          iVar12 = pVVar8->nSize;
          pVVar8->nSize = iVar12 + 1;
          pVVar8->pArray[iVar12] = p;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vOnehots->nSize);
  }
  pVVar10 = pPart->vCis;
  if (0 < pVVar10->nSize) {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)pVVar10->pArray[lVar6] + 0x28) = 0;
      lVar6 = lVar6 + 1;
      pVVar10 = pPart->vCis;
    } while (lVar6 < pVVar10->nSize);
  }
  if (fVerbose != 0 && pVVar8 != (Vec_Ptr_t *)0x0) {
    printf("Partition contains %d groups of 1-hot registers: { ",(ulong)(uint)pVVar8->nSize);
    if (0 < pVVar8->nSize) {
      lVar6 = 0;
      do {
        printf("%d ",(ulong)*(uint *)((long)pVVar8->pArray[lVar6] + 4));
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar8->nSize);
    }
    puts("}");
  }
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Aig_ManRegProjectOnehots( Aig_Man_t * pAig, Aig_Man_t * pPart, Vec_Ptr_t * vOnehots, int fVerbose )
{
    Vec_Ptr_t * vOnehotsPart = NULL;
    Vec_Int_t * vGroup, * vGroupNew;
    Aig_Obj_t * pObj, * pObjNew;
    int nOffset, iReg, i, k;
    // set the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = i;
    // go through each group and check if registers are involved in this one
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, i )
    {
        vGroupNew = NULL;
        Vec_IntForEachEntry( vGroup, iReg, k )
        {
            pObj = Aig_ManCi( pAig, nOffset+iReg );
            if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
                continue;
            if ( vGroupNew == NULL )
                vGroupNew = Vec_IntAlloc( Vec_IntSize(vGroup) );
            pObjNew = (Aig_Obj_t *)pObj->pData;
            Vec_IntPush( vGroupNew, pObjNew->iData );
        }
        if ( vGroupNew == NULL )
            continue;
        if ( Vec_IntSize(vGroupNew) > 1 )
        {
            if ( vOnehotsPart == NULL )
                vOnehotsPart = Vec_PtrAlloc( 100 );
            Vec_PtrPush( vOnehotsPart, vGroupNew );
        }
        else
            Vec_IntFree( vGroupNew );
    }
    // clear the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = 0;
    // print out
    if ( vOnehotsPart && fVerbose )
    {
        printf( "Partition contains %d groups of 1-hot registers: { ", Vec_PtrSize(vOnehotsPart) );
        Vec_PtrForEachEntry( Vec_Int_t *, vOnehotsPart, vGroup, k )
            printf( "%d ", Vec_IntSize(vGroup) );
        printf( "}\n" );
    }
    return vOnehotsPart;
}